

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_response_headers_received
              (nghttp2_session *session,nghttp2_frame *frame,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_frame *in_RDX;
  nghttp2_session *in_RSI;
  nghttp2_frame *in_RDI;
  int rv;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(int *)((long)in_RDX + 0xcc) == 1) &&
     (iVar1 = nghttp2_session_is_my_stream_id
                        ((nghttp2_session *)&in_RDI->hd,*(int32_t *)&(in_RSI->streams).mem),
     iVar1 != 0)) {
    iVar1 = (int)((ulong)in_RSI >> 0x20);
    if (*(int *)&(in_RSI->streams).mem == 0) {
      iVar1 = session_inflate_handle_invalid_connection
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,iVar1,
                         (char *)in_RDX);
    }
    else if ((*(byte *)((long)in_RDX + 0xd9) & 1) == 0) {
      *(undefined4 *)((long)in_RDX + 0xcc) = 2;
      iVar1 = session_call_on_begin_headers(in_RSI,in_RDX);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = session_inflate_handle_invalid_connection
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,iVar1,
                         (char *)in_RDX);
    }
    return iVar1;
  }
  __assert_fail("stream->state == NGHTTP2_STREAM_OPENING && nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                ,0x10bc,
                "int nghttp2_session_on_response_headers_received(nghttp2_session *, nghttp2_frame *, nghttp2_stream *)"
               );
}

Assistant:

int nghttp2_session_on_response_headers_received(nghttp2_session *session,
                                                 nghttp2_frame *frame,
                                                 nghttp2_stream *stream) {
  int rv;
  /* This function is only called if stream->state ==
     NGHTTP2_STREAM_OPENING and stream_id is local side initiated. */
  assert(stream->state == NGHTTP2_STREAM_OPENING &&
         nghttp2_session_is_my_stream_id(session, frame->hd.stream_id));
  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "response HEADERS: stream_id == 0");
  }
  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    /* half closed (remote): from the spec:

       If an endpoint receives additional frames for a stream that is
       in this state it MUST respond with a stream error (Section
       5.4.2) of type STREAM_CLOSED.

       We go further, and make it connection error.
    */
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_STREAM_CLOSED, "HEADERS: stream closed");
  }
  stream->state = NGHTTP2_STREAM_OPENED;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}